

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadTable
              (Scl_Tree_t *p,Vec_Str_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  void **ppvVar1;
  Vec_Flt_t *pVVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  Vec_Flt_t *pVVar8;
  Vec_Flt_t *__ptr;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Scl_Item_t *pSVar13;
  Vec_Flt_t *pVVar14;
  Vec_Flt_t *pVVar15;
  Vec_Flt_t *local_58;
  Vec_Flt_t *local_50;
  ulong local_48;
  
  uVar9 = pTiming->Child;
  iVar5 = p->nItems;
  if ((int)uVar9 < iVar5) {
    if ((int)uVar9 < 0) {
      pSVar13 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar13 = p->pItems + uVar9;
    }
    if (pSVar13 == (Scl_Item_t *)0x0) {
      return 0;
    }
    pcVar7 = p->pContents;
    while( true ) {
      iVar4 = (pSVar13->Key).Beg;
      iVar10 = (pSVar13->Key).End - iVar4;
      iVar4 = strncmp(pcVar7 + iVar4,pName,(long)iVar10);
      if ((iVar4 == 0) && (sVar6 = strlen(pName), iVar10 == (int)sVar6)) break;
      uVar9 = pSVar13->Next;
      if (iVar5 <= (int)uVar9) goto LAB_003e8777;
      if ((int)uVar9 < 0) {
        pSVar13 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar13 = p->pItems + uVar9;
      }
      if (pSVar13 == (Scl_Item_t *)0x0) {
        return 0;
      }
    }
    pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
    if (*pcVar7 == '\0') {
      uVar9 = pSVar13->Child;
      if ((int)uVar9 < p->nItems) {
        if ((int)uVar9 < 0) {
          pSVar13 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar13 = p->pItems + uVar9;
        }
        if (pSVar13 == (Scl_Item_t *)0x0) {
          pVVar8 = (Vec_Flt_t *)0x0;
          local_50 = (Vec_Flt_t *)0x0;
          local_58 = (Vec_Flt_t *)0x0;
        }
        else {
          local_58 = (Vec_Flt_t *)0x0;
          local_50 = (Vec_Flt_t *)0x0;
          pVVar8 = (Vec_Flt_t *)0x0;
          do {
            iVar4 = (pSVar13->Key).Beg;
            pcVar7 = p->pContents + iVar4;
            iVar4 = (pSVar13->Key).End - iVar4;
            sVar6 = (size_t)iVar4;
            iVar5 = strncmp(pcVar7,"index_1",sVar6);
            if (iVar4 == 7 && iVar5 == 0) {
              if (pVVar8 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex1 == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x4b2,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
              pVVar8 = Scl_LibertyReadFloatVec(pcVar7);
            }
            else {
              iVar5 = strncmp(pcVar7,"index_2",sVar6);
              if ((iVar5 == 0) && (iVar4 == 7)) {
                if (local_50 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vIndex2 == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                ,0x4b4,
                                "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
                local_50 = Scl_LibertyReadFloatVec(pcVar7);
              }
              else {
                iVar5 = strncmp(pcVar7,"values",sVar6);
                if ((iVar5 == 0) && (iVar4 == 6)) {
                  if (local_58 != (Vec_Flt_t *)0x0) {
                    __assert_fail("vValues == NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                  ,0x4b6,
                                  "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                                 );
                  }
                  pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
                  local_58 = Scl_LibertyReadFloatVec(pcVar7);
                }
              }
            }
            uVar9 = pSVar13->Next;
            if (p->nItems <= (int)uVar9) goto LAB_003e8777;
            if ((int)uVar9 < 0) {
              pSVar13 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar13 = p->pItems + uVar9;
            }
          } while (pSVar13 != (Scl_Item_t *)0x0);
        }
        if (((pVVar8 != (Vec_Flt_t *)0x0) && (local_50 != (Vec_Flt_t *)0x0)) &&
           (local_58 != (Vec_Flt_t *)0x0)) {
          Vec_StrPutI_(vOut,pVVar8->nSize);
          if (0 < pVVar8->nSize) {
            lVar11 = 0;
            do {
              Vec_StrPutF_(vOut,pVVar8->pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar8->nSize);
          }
          Vec_StrPutI_(vOut,local_50->nSize);
          iVar5 = local_50->nSize;
          if (0 < iVar5) {
            lVar11 = 0;
            do {
              Vec_StrPutF_(vOut,local_50->pArray[lVar11]);
              lVar11 = lVar11 + 1;
              iVar5 = local_50->nSize;
            } while (lVar11 < iVar5);
          }
          if (iVar5 * pVVar8->nSize != local_58->nSize) {
            __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                          ,0x4c9,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          __ptr = local_58;
          if (0 < local_58->nSize) {
            lVar11 = 0;
            do {
              Vec_StrPutF_(vOut,local_58->pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_58->nSize);
          }
LAB_003e86c1:
          iVar5 = 3;
          do {
            Vec_StrPutF_(vOut,0.0);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          iVar5 = 4;
          do {
            Vec_StrPutF_(vOut,0.0);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          iVar5 = 6;
          do {
            Vec_StrPutF_(vOut,0.0);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          if (pVVar8 != (Vec_Flt_t *)0x0) {
            if (pVVar8->pArray != (float *)0x0) {
              free(pVVar8->pArray);
              pVVar8->pArray = (float *)0x0;
            }
            free(pVVar8);
          }
          if (local_50 != (Vec_Flt_t *)0x0) {
            if (local_50->pArray != (float *)0x0) {
              free(local_50->pArray);
              local_50->pArray = (float *)0x0;
            }
            free(local_50);
          }
          if (__ptr != (Vec_Flt_t *)0x0) {
            if (__ptr->pArray != (float *)0x0) {
              free(__ptr->pArray);
              __ptr->pArray = (float *)0x0;
            }
            free(__ptr);
            return 1;
          }
          return 1;
        }
        pcVar7 = "Incomplete table specification";
LAB_003e8339:
        puts(pcVar7);
        return 0;
      }
    }
    else {
      iVar5 = vTemples->nSize;
      local_48 = 0xffffffff;
      uVar3 = local_48;
      if (0 < (long)iVar5) {
        uVar12 = 0;
        do {
          if (((uVar12 & 3) == 0) &&
             (iVar4 = strcmp(pcVar7,(char *)vTemples->pArray[uVar12]), uVar3 = uVar12, iVar4 == 0))
          break;
          uVar12 = uVar12 + 1;
          uVar3 = local_48;
        } while ((long)iVar5 != uVar12);
      }
      local_48 = uVar3;
      if ((int)local_48 == -1) {
        pcVar7 = "Template cannot be found in the template library";
        goto LAB_003e8339;
      }
      uVar9 = pSVar13->Child;
      if ((int)uVar9 < p->nItems) {
        if ((int)uVar9 < 0) {
          pSVar13 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar13 = p->pItems + uVar9;
        }
        if (pSVar13 == (Scl_Item_t *)0x0) {
          local_58 = (Vec_Flt_t *)0x0;
          local_50 = (Vec_Flt_t *)0x0;
          __ptr = (Vec_Flt_t *)0x0;
        }
        else {
          __ptr = (Vec_Flt_t *)0x0;
          local_50 = (Vec_Flt_t *)0x0;
          local_58 = (Vec_Flt_t *)0x0;
          do {
            iVar4 = (pSVar13->Key).Beg;
            pcVar7 = p->pContents + iVar4;
            iVar4 = (pSVar13->Key).End - iVar4;
            sVar6 = (size_t)iVar4;
            iVar5 = strncmp(pcVar7,"index_1",sVar6);
            if (iVar4 == 7 && iVar5 == 0) {
              if (local_58 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex1 == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x4e1,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
              local_58 = Scl_LibertyReadFloatVec(pcVar7);
            }
            else {
              iVar5 = strncmp(pcVar7,"index_2",sVar6);
              if ((iVar5 == 0) && (iVar4 == 7)) {
                if (local_50 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vIndex2 == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                ,0x4e3,
                                "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
                local_50 = Scl_LibertyReadFloatVec(pcVar7);
              }
              else {
                iVar5 = strncmp(pcVar7,"values",sVar6);
                if ((iVar5 == 0) && (iVar4 == 6)) {
                  if (__ptr != (Vec_Flt_t *)0x0) {
                    __assert_fail("vValues == NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                  ,0x4e5,
                                  "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                                 );
                  }
                  pcVar7 = Scl_LibertyReadString(p,pSVar13->Head);
                  __ptr = Scl_LibertyReadFloatVec(pcVar7);
                }
              }
            }
            uVar9 = pSVar13->Next;
            if (p->nItems <= (int)uVar9) goto LAB_003e8777;
            if ((int)uVar9 < 0) {
              pSVar13 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar13 = p->pItems + uVar9;
            }
          } while (pSVar13 != (Scl_Item_t *)0x0);
        }
        if (-3 < (int)local_48) {
          if (((int)((int)local_48 + 2U) < vTemples->nSize) &&
             ((int)((int)local_48 + 3U) < vTemples->nSize)) {
            ppvVar1 = vTemples->pArray;
            pVVar15 = (Vec_Flt_t *)ppvVar1[(int)local_48 + 2U];
            pVVar2 = (Vec_Flt_t *)ppvVar1[(int)local_48 + 3U];
            pVVar8 = local_58;
            if (ppvVar1[(long)(int)local_48 + 1] == (void *)0x0) {
              if ((local_58 != (Vec_Flt_t *)0x0) && (local_58->nSize != pVVar15->nSize)) {
                __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x4ec,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pVVar14 = pVVar2;
              if ((local_50 != (Vec_Flt_t *)0x0) &&
                 (pVVar14 = local_50, local_50->nSize != pVVar2->nSize)) {
                __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x4ed,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (local_58 != (Vec_Flt_t *)0x0) {
                pVVar15 = local_58;
              }
              Vec_StrPutI_(vOut,pVVar15->nSize);
              if (0 < pVVar15->nSize) {
                lVar11 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar15->pArray[lVar11]);
                  lVar11 = lVar11 + 1;
                } while (lVar11 < pVVar15->nSize);
              }
              Vec_StrPutI_(vOut,pVVar14->nSize);
              iVar5 = pVVar14->nSize;
              if (0 < iVar5) {
                lVar11 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar14->pArray[lVar11]);
                  lVar11 = lVar11 + 1;
                  iVar5 = pVVar14->nSize;
                } while (lVar11 < iVar5);
              }
              if (iVar5 * pVVar15->nSize != __ptr->nSize) {
                __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x4fc,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (0 < __ptr->nSize) {
                lVar11 = 0;
                do {
                  Vec_StrPutF_(vOut,__ptr->pArray[lVar11]);
                  lVar11 = lVar11 + 1;
                } while (lVar11 < __ptr->nSize);
              }
            }
            else {
              if ((local_50 != (Vec_Flt_t *)0x0) && (local_50->nSize != pVVar15->nSize)) {
                __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x506,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pVVar14 = pVVar2;
              if ((local_58 != (Vec_Flt_t *)0x0) &&
                 (pVVar14 = local_58, local_58->nSize != pVVar2->nSize)) {
                __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x507,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (local_50 != (Vec_Flt_t *)0x0) {
                pVVar15 = local_50;
              }
              Vec_StrPutI_(vOut,pVVar15->nSize);
              if (0 < pVVar15->nSize) {
                lVar11 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar15->pArray[lVar11]);
                  lVar11 = lVar11 + 1;
                } while (lVar11 < pVVar15->nSize);
              }
              Vec_StrPutI_(vOut,pVVar14->nSize);
              iVar5 = pVVar14->nSize;
              if (0 < iVar5) {
                lVar11 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar14->pArray[lVar11]);
                  lVar11 = lVar11 + 1;
                  iVar5 = pVVar14->nSize;
                } while (lVar11 < iVar5);
              }
              if (iVar5 * pVVar15->nSize != __ptr->nSize) {
                __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x516,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              iVar5 = __ptr->nSize;
              if (0 < iVar5) {
                iVar4 = 0;
                do {
                  uVar9 = (iVar4 % pVVar14->nSize) * pVVar15->nSize + iVar4 / pVVar14->nSize;
                  if (((int)uVar9 < 0) || (iVar5 <= (int)uVar9)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                  }
                  Vec_StrPutF_(vOut,__ptr->pArray[uVar9]);
                  iVar4 = iVar4 + 1;
                  iVar5 = __ptr->nSize;
                } while (iVar4 < iVar5);
              }
            }
            goto LAB_003e86c1;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
  }
LAB_003e8777:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadTable( Scl_Tree_t * p, Vec_Str_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
        Vec_FltForEachEntry( vInd1, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
        Vec_FltForEachEntry( vInd2, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );
        // write entries
        assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
        Vec_FltForEachEntry( vValues, Entry, i )
        {
            Vec_StrPutF_( vOut, Entry );
            if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                Vec_StrPut_( vOut );
        }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
    }
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_FltFreeP( &vIndex1 );
    Vec_FltFreeP( &vIndex2 );
    Vec_FltFreeP( &vValues );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    return 1;
}